

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  sqlite3_value *pValue;
  
  if (pTab->pSelect == (Select *)0x0) {
    pValue = (sqlite3_value *)0x0;
    sqlite3ValueFromExpr(v->db,pTab->aCol[i].pDflt,v->db->enc,pTab->aCol[i].affinity,&pValue);
    if (pValue != (sqlite3_value *)0x0) {
      sqlite3VdbeAppendP4(v,pValue,-7);
    }
  }
  if (pTab->aCol[i].affinity != 'E') {
    return;
  }
  sqlite3VdbeAddOp1(v,0x5c,iReg);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  assert( pTab!=0 );
  if( !pTab->pSelect ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    Column *pCol = &pTab->aCol[i];
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v), pCol->pDflt, enc, 
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}